

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp2::groebnerRow5_00_f
               (Matrix<double,_10,_6,_0,_10,_6> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  lVar5 = (long)targetRow;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[lVar5 + 10];
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar7,auVar4);
  auVar8._0_8_ = auVar6._0_8_ /
                 (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[0xf];
  auVar8._8_8_ = auVar6._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.m_data.
  array[lVar5 + 10] = 0.0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[0x19];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[lVar5 + 0x14];
  auVar6 = vfmadd213sd_fma(auVar9,auVar8,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.m_data.
  array[lVar5 + 0x14] = auVar6._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.
       m_data.array[0x23];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[lVar5 + 0x1e];
  auVar6 = vfmadd213sd_fma(auVar10,auVar8,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.m_data.
  array[lVar5 + 0x1e] = auVar6._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.
       m_data.array[0x2d];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[lVar5 + 0x28];
  auVar6 = vfmadd213sd_fma(auVar11,auVar8,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.m_data.
  array[lVar5 + 0x28] = auVar6._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.
       m_data.array[0x37];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).
                 m_storage.m_data.array[lVar5 + 0x32];
  auVar6 = vfmadd213sd_fma(auVar12,auVar8,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_10,_6,_0,_10,_6>_>).m_storage.m_data.
  array[lVar5 + 0x32] = auVar6._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp2::groebnerRow5_00_f( Eigen::Matrix<double,10,6> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,1) / groebnerMatrix(5,1);
  groebnerMatrix(targetRow,1) = 0.0;
  groebnerMatrix(targetRow,2) -= factor * groebnerMatrix(5,2);
  groebnerMatrix(targetRow,3) -= factor * groebnerMatrix(5,3);
  groebnerMatrix(targetRow,4) -= factor * groebnerMatrix(5,4);
  groebnerMatrix(targetRow,5) -= factor * groebnerMatrix(5,5);
}